

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec3<double>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  double *pdVar5;
  char *in_RDI;
  Box<Imath_3_2::Vec3<double>_> b_1;
  Vec3<double> max;
  Vec3<double> min;
  Box<Imath_3_2::Vec3<double>_> b1;
  int hi;
  int lo;
  uint i;
  Vec3<double> p1;
  Vec3<double> p0;
  Box<Imath_3_2::Vec3<double>_> b0;
  Box<Imath_3_2::Vec3<double>_> b;
  Box<Imath_3_2::Vec3<double>_> *in_stack_fffffffffffffe80;
  Vec3<double> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  Box<Imath_3_2::Vec3<double>_> *in_stack_fffffffffffffea8;
  Box<Imath_3_2::Vec3<double>_> *in_stack_fffffffffffffeb0;
  Vec3<double> local_138;
  Vec3<double> local_120 [3];
  int local_d4;
  int local_d0;
  uint local_cc;
  Vec3<double> local_c8;
  Vec3<double> local_b0;
  Vec3<double> local_98;
  Vec3<double> local_80 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    isInfinite() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::Box(in_stack_fffffffffffffe80);
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::makeInfinite(in_stack_fffffffffffffeb0);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::isInfinite(in_stack_fffffffffffffea8);
  if (!bVar1) {
    __assert_fail("b.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x318,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec3<double>]"
                 );
  }
  Imath_3_2::Vec3<double>::Vec3(local_80,-1.0);
  Imath_3_2::Vec3<double>::Vec3(&local_98,1.0);
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::Box
            ((Box<Imath_3_2::Vec3<double>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88
             ,&in_stack_fffffffffffffe80->min);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::isInfinite(in_stack_fffffffffffffea8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x323,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec3<double>]"
                 );
  }
  Imath_3_2::Vec3<double>::Vec3(&local_b0);
  Imath_3_2::Vec3<double>::Vec3(&local_c8);
  local_cc = 0;
  while( true ) {
    uVar3 = local_cc;
    uVar2 = Imath_3_2::Vec3<double>::dimensions();
    if (uVar2 <= uVar3) break;
    local_d0 = 1 << ((char)local_cc + 1U & 0x1f);
    uVar3 = Imath_3_2::Vec3<double>::dimensions();
    local_d4 = 1 << ((char)uVar3 - (char)local_cc & 0x1fU);
    in_stack_fffffffffffffe80 = (Box<Imath_3_2::Vec3<double>_> *)-(double)local_d0;
    pdVar5 = Imath_3_2::Vec3<double>::operator[](&local_b0,local_cc);
    *pdVar5 = (double)in_stack_fffffffffffffe80;
    in_stack_fffffffffffffe88 = (Vec3<double> *)(double)local_d4;
    pdVar5 = Imath_3_2::Vec3<double>::operator[](&local_c8,local_cc);
    *pdVar5 = (double)in_stack_fffffffffffffe88;
    local_cc = local_cc + 1;
  }
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::Box
            ((Box<Imath_3_2::Vec3<double>_> *)CONCAT44(uVar3,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,&in_stack_fffffffffffffe80->min);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::isInfinite(in_stack_fffffffffffffea8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x32f,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec3<double>]"
                 );
  }
  Imath_3_2::Vec3<double>::Vec3(local_120,0.0);
  Imath_3_2::Vec3<double>::Vec3(&local_138,local_120);
  uVar2 = Imath_3_2::Vec3<double>::dimensions();
  pdVar5 = Imath_3_2::Vec3<double>::operator[](&local_138,uVar2 - 1);
  *pdVar5 = 2.0;
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::Box
            ((Box<Imath_3_2::Vec3<double>_> *)CONCAT44(uVar3,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,&in_stack_fffffffffffffe80->min);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::isInfinite(in_stack_fffffffffffffea8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x340,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec3<double>]"
                 );
  }
  return;
}

Assistant:

void
testIsInfinite (const char* type)
{
    cout << "    isInfinite() for type " << type << endl;

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite ();
        assert (b.isInfinite ());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (!b0.isInfinite ());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            int lo = 1 << (i + 1);
            int hi = 1 << (T::dimensions () - i);
            p0[i] = -static_cast<typename T::BaseType>(lo);
            p1[i] = static_cast<typename T::BaseType>(hi);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
        assert (!b1.isInfinite ());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (!b.isInfinite ());
    }
}